

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

void __thiscall
gimage::ImageIO::load(ImageIO *this,ImageFloat *image,char *name,int ds,long x,long y,long w,long h)

{
  float ***pppfVar1;
  undefined1 auVar2 [16];
  ImageFloat *pIVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  iterator iVar7;
  BasicImageIO *pBVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int depth;
  long local_270;
  char *local_268;
  ImageFloat *local_260;
  long local_258;
  long local_250;
  float *local_248;
  ulong local_240;
  void *local_238;
  long local_230;
  long local_228;
  long local_220;
  ulong local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long theight;
  long twidth;
  ImageIO *local_1d8;
  BasicImageIO *local_1d0;
  long local_1c8;
  long tborder;
  int local_1b4;
  string tname;
  int local_188;
  Image<float,_gimage::PixelTraits<float>_> timage;
  long height;
  long width;
  string s_1;
  string suffix;
  string prefix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string s;
  
  local_250 = x;
  local_228 = y;
  local_1d8 = this;
  std::__cxx11::string::string((string *)&s,name,(allocator *)&timage);
  uVar6 = std::__cxx11::string::rfind((char)&s,0x3a);
  if ((uVar6 == 0xffffffffffffffff) ||
     (iVar4 = std::__cxx11::string::compare((ulong)&s,uVar6,(char *)0x2), iVar4 == 0)) {
    pBVar8 = getBasicImageIO(local_1d8,name,true);
    (*pBVar8->_vptr_BasicImageIO[8])(pBVar8,image,name,(ulong)(uint)ds,local_250,local_228,w,h);
  }
  else {
    local_1d0 = getBasicImageIO(local_1d8,name,true);
    std::__cxx11::string::string((string *)&s_1,name,(allocator *)&timage);
    uVar6 = std::__cxx11::string::rfind((char)&s_1,0x3a);
    if (uVar6 != 0xffffffffffffffff) {
      std::__cxx11::string::compare((ulong)&s_1,uVar6,(char *)0x2);
    }
    std::__cxx11::string::substr((ulong)&prefix,(ulong)&s_1);
    std::__cxx11::string::substr((ulong)&suffix,(ulong)&s_1);
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &list._M_t._M_impl.super__Rb_tree_header._M_header;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    list._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    list._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    anon_unknown_17::loadTiledHeader
              (local_1d0,&list,&prefix,&suffix,&twidth,&theight,&tborder,&width,&height,&depth);
    local_270 = w;
    if (w < 1) {
      local_270 = (width + ds + -1) / (long)ds;
    }
    local_258 = h;
    if (h < 1) {
      local_258 = (height + ds + -1) / (long)ds;
    }
    local_208 = twidth + tborder * -2;
    lVar18 = theight + tborder * -2;
    local_268 = name;
    local_260 = image;
    if (tborder == 0 && ds == 1) {
      local_1f8 = 0;
      if (0 < local_250) {
        local_1f8 = local_250;
      }
      local_1f8 = local_1f8 / local_208;
      lVar24 = 0;
      if (0 < local_228) {
        lVar24 = local_228;
      }
      local_248 = (float *)((local_270 + local_250 + -1) / local_208);
      local_240 = (local_258 + local_228 + -1) / lVar18;
      Image<float,_gimage::PixelTraits<float>_>::setSize(image,local_270,local_258,(long)depth);
      auVar2 = _DAT_00162f70;
      lVar13 = image->n;
      if (lVar13 != 0) {
        lVar15 = -lVar13;
        if (0 < lVar13) {
          lVar15 = lVar13;
        }
        pfVar14 = image->pixel;
        lVar13 = lVar15 + -1;
        auVar26._8_4_ = (int)lVar13;
        auVar26._0_8_ = lVar13;
        auVar26._12_4_ = (int)((ulong)lVar13 >> 0x20);
        uVar6 = 0;
        auVar26 = auVar26 ^ _DAT_00162f70;
        auVar34 = _DAT_00163090;
        auVar30 = _DAT_001630a0;
        do {
          auVar33 = auVar30 ^ auVar2;
          iVar4 = auVar26._4_4_;
          if ((bool)(~(auVar33._4_4_ == iVar4 && auVar26._0_4_ < auVar33._0_4_ ||
                      iVar4 < auVar33._4_4_) & 1)) {
            pfVar14[uVar6] = INFINITY;
          }
          if ((auVar33._12_4_ != auVar26._12_4_ || auVar33._8_4_ <= auVar26._8_4_) &&
              auVar33._12_4_ <= auVar26._12_4_) {
            pfVar14[uVar6 + 1] = INFINITY;
          }
          auVar33 = auVar34 ^ auVar2;
          iVar5 = auVar33._4_4_;
          if (iVar5 <= iVar4 && (iVar5 != iVar4 || auVar33._0_4_ <= auVar26._0_4_)) {
            pfVar14[uVar6 + 2] = INFINITY;
            pfVar14[uVar6 + 3] = INFINITY;
          }
          uVar6 = uVar6 + 4;
          lVar13 = auVar30._8_8_;
          auVar30._0_8_ = auVar30._0_8_ + 4;
          auVar30._8_8_ = lVar13 + 4;
          lVar13 = auVar34._8_8_;
          auVar34._0_8_ = auVar34._0_8_ + 4;
          auVar34._8_8_ = lVar13 + 4;
        } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar6);
      }
      iVar4 = (int)(lVar24 / lVar18);
      if (iVar4 <= (int)local_240) {
        local_270 = local_270 + local_250;
        local_258 = local_258 + local_228;
        local_200 = (long)(int)local_1f8;
        local_1f0 = CONCAT44(local_1f0._4_4_,(int)local_248 + 1);
        local_230 = (long)iVar4;
        local_240 = (ulong)((int)local_240 + 1);
        lVar24 = local_208;
        do {
          if ((int)local_1f8 <= (int)local_248) {
            local_220 = local_228 - local_230 * lVar18;
            if (local_220 < 1) {
              local_220 = 0;
            }
            lVar15 = local_230 * lVar18 + local_220;
            local_238 = (void *)(local_258 - lVar15);
            lVar15 = lVar15 - local_228;
            lVar13 = local_200;
            do {
              lVar16 = local_250 - lVar13 * lVar24;
              if (lVar16 < 1) {
                lVar16 = 0;
              }
              lVar22 = lVar13 * lVar24 + lVar16;
              lVar24 = local_270 - lVar22;
              if (twidth - lVar16 <= lVar24) {
                lVar24 = twidth - lVar16;
              }
              pvVar12 = (void *)(theight - local_220);
              if ((long)local_238 < theight - local_220) {
                pvVar12 = local_238;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_230,(int)lVar13,&suffix);
              timage.depth = 0;
              timage.row = (float **)0x0;
              timage.img = (float ***)0x0;
              timage.n = 0;
              timage.pixel = (float *)0x0;
              timage.width = 0;
              timage.height = 0;
              Image<float,_gimage::PixelTraits<float>_>::setSize
                        (&timage,lVar24,(long)pvVar12,(long)depth);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar7._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1d0->_vptr_BasicImageIO[8])
                          (local_1d0,&timage,tname._M_dataplus._M_p,1,lVar16,local_220,lVar24,
                           pvVar12);
                if (0 < timage.height) {
                  lVar24 = 0;
                  do {
                    if (0 < timage.width) {
                      pppfVar1 = local_260->img;
                      lVar16 = 0;
                      do {
                        if (0 < depth) {
                          uVar6 = 0;
                          do {
                            pppfVar1[uVar6][lVar15 + lVar24][(lVar22 - local_250) + lVar16] =
                                 timage.img[uVar6][lVar24][lVar16];
                            uVar6 = uVar6 + 1;
                          } while ((uint)depth != uVar6);
                        }
                        lVar16 = lVar16 + 1;
                      } while (lVar16 != timage.width);
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != timage.height);
                }
              }
              Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              lVar13 = lVar13 + 1;
              lVar24 = local_208;
            } while ((int)local_1f0 != (int)lVar13);
          }
          local_230 = local_230 + 1;
        } while ((int)local_240 != (int)local_230);
      }
    }
    else {
      local_1f0 = (long)ds;
      lVar13 = local_1f0 * local_250;
      lVar24 = lVar13 - tborder;
      if (lVar13 - tborder < 1) {
        lVar24 = 0;
      }
      lVar24 = lVar24 / local_208;
      lVar16 = local_1f0 * local_228;
      lVar15 = lVar16 - tborder;
      if (lVar16 - tborder < 1) {
        lVar15 = 0;
      }
      lVar22 = ((local_250 + local_270 + -1) * local_1f0 + tborder) / local_208;
      local_218 = ((local_258 + local_228 + -1) * local_1f0 + tborder) / lVar18;
      lVar23 = (long)depth;
      lVar21 = local_270 * local_258;
      uVar6 = lVar21 * 4;
      local_248 = (float *)operator_new(lVar23 * uVar6);
      memset(local_248,0,lVar23 * uVar6);
      local_238 = operator_new(uVar6);
      memset(local_238,0,uVar6);
      iVar4 = (int)(lVar15 / lVar18);
      if (iVar4 <= (int)local_218) {
        lVar23 = (local_270 + local_250) * local_1f0;
        lVar15 = (local_258 + local_228) * local_1f0;
        local_188 = (int)lVar24;
        iVar5 = (int)lVar22;
        local_1b4 = iVar5 + 1;
        local_210 = (long)iVar4;
        local_218 = (ulong)((int)local_218 + 1);
        local_200 = local_270 * 4;
        lVar24 = local_208;
        do {
          if (local_188 <= iVar5) {
            lVar9 = local_210 * lVar18;
            lVar22 = (long)local_188;
            do {
              local_220 = lVar22 * lVar24;
              local_240 = (tborder - local_220) + lVar13;
              if ((long)local_240 < 1) {
                local_240 = 0;
              }
              lVar24 = tborder - lVar9;
              local_1c8 = lVar24 + lVar16;
              if (local_1c8 < 1) {
                local_1c8 = 0;
              }
              lVar20 = ((tborder - local_220) + lVar23) - local_240;
              if ((long)(twidth - local_240) <= lVar20) {
                lVar20 = twidth - local_240;
              }
              lVar24 = (lVar24 + lVar15) - local_1c8;
              if (theight - local_1c8 <= lVar24) {
                lVar24 = theight - local_1c8;
              }
              anon_unknown_17::getTileName(&tname,&prefix,(int)local_210,(int)lVar22,&suffix);
              timage.depth = 0;
              timage._40_16_ = ZEXT816(0);
              timage._24_16_ = ZEXT816(0);
              timage._8_16_ = ZEXT816(0);
              local_230 = lVar20;
              Image<float,_gimage::PixelTraits<float>_>::setSize(&timage,lVar20,lVar24,(long)depth);
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&list._M_t,&tname);
              if ((_Rb_tree_header *)iVar7._M_node != &list._M_t._M_impl.super__Rb_tree_header) {
                (*local_1d0->_vptr_BasicImageIO[8])
                          (local_1d0,&timage,tname._M_dataplus._M_p,1,local_240,local_1c8,local_230,
                           lVar24);
                if (0 < timage.height) {
                  fVar25 = (float)tborder + (float)tborder;
                  local_1f8 = twidth;
                  local_230 = tborder;
                  local_220 = (local_220 + local_240) - (lVar13 + tborder);
                  lVar24 = 0;
                  do {
                    if (0 < timage.width) {
                      fVar29 = (float)(local_1c8 + lVar24) / fVar25;
                      fVar28 = (float)(theight - (local_1c8 + lVar24)) / fVar25;
                      if (fVar29 <= fVar28) {
                        fVar28 = fVar29;
                      }
                      if (1.0 <= fVar28) {
                        fVar28 = 1.0;
                      }
                      if (fVar28 <= 1e-06) {
                        fVar28 = 1e-06;
                      }
                      lVar20 = 0;
                      do {
                        if (timage.depth < 1) {
LAB_001368dc:
                          lVar10 = (local_220 + lVar20) / local_1f0;
                          lVar11 = (((local_1c8 + lVar9) - (lVar16 + tborder)) + lVar24) / local_1f0
                          ;
                          if (tborder < 1) {
                            if (0 < depth) {
                              pfVar14 = (float *)(local_200 * lVar11 + lVar10 * 4 + (long)local_248)
                              ;
                              uVar6 = 0;
                              do {
                                *pfVar14 = timage.img[uVar6][lVar24][lVar20] + *pfVar14;
                                uVar6 = uVar6 + 1;
                                pfVar14 = pfVar14 + lVar21;
                              } while ((uint)depth != uVar6);
                            }
                            pvVar12 = (void *)((long)local_238 + lVar11 * local_270 * 4);
                            fVar29 = *(float *)((long)pvVar12 + lVar10 * 4) + 1.0;
                          }
                          else {
                            fVar32 = (float)(long)(local_240 + lVar20) / fVar25;
                            fVar29 = (float)(long)(twidth - (local_240 + lVar20)) / fVar25;
                            if (fVar32 <= fVar29) {
                              fVar29 = fVar32;
                            }
                            if (1.0 <= fVar29) {
                              fVar29 = 1.0;
                            }
                            if (fVar29 <= 1e-06) {
                              fVar29 = 1e-06;
                            }
                            if (0 < depth) {
                              pfVar14 = (float *)(local_200 * lVar11 + lVar10 * 4 + (long)local_248)
                              ;
                              uVar6 = 0;
                              do {
                                *pfVar14 = timage.img[uVar6][lVar24][lVar20] * fVar29 * fVar28 +
                                           *pfVar14;
                                uVar6 = uVar6 + 1;
                                pfVar14 = pfVar14 + lVar21;
                              } while ((uint)depth != uVar6);
                            }
                            pvVar12 = (void *)((long)local_238 + lVar11 * local_270 * 4);
                            fVar29 = fVar29 * fVar28 + *(float *)((long)pvVar12 + lVar10 * 4);
                          }
                          *(float *)((long)pvVar12 + lVar10 * 4) = fVar29;
                        }
                        else if ((uint)ABS((*timage.img)[lVar24][lVar20]) < 0x7f800000) {
                          uVar6 = 0;
                          do {
                            if ((ulong)(uint)timage.depth - 1 == uVar6) goto LAB_001368dc;
                            lVar10 = uVar6 + 1;
                            uVar6 = uVar6 + 1;
                          } while ((uint)ABS(timage.img[lVar10][lVar24][lVar20]) < 0x7f800000);
                          if ((uint)timage.depth <= uVar6) goto LAB_001368dc;
                        }
                        lVar20 = lVar20 + 1;
                      } while (lVar20 != timage.width);
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != timage.height);
                }
              }
              Image<float,_gimage::PixelTraits<float>_>::~Image(&timage);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)tname._M_dataplus._M_p != &tname.field_2) {
                operator_delete(tname._M_dataplus._M_p);
              }
              lVar22 = lVar22 + 1;
              lVar24 = local_208;
            } while (local_1b4 != (int)lVar22);
          }
          local_210 = local_210 + 1;
        } while ((int)local_218 != (int)local_210);
      }
      lVar24 = local_258;
      pIVar3 = local_260;
      Image<float,_gimage::PixelTraits<float>_>::setSize(local_260,local_270,local_258,(long)depth);
      auVar2 = _DAT_00162f70;
      lVar18 = pIVar3->n;
      if (lVar18 != 0) {
        lVar13 = -lVar18;
        if (0 < lVar18) {
          lVar13 = lVar18;
        }
        pfVar14 = pIVar3->pixel;
        lVar18 = lVar13 + -1;
        auVar27._8_4_ = (int)lVar18;
        auVar27._0_8_ = lVar18;
        auVar27._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar6 = 0;
        auVar27 = auVar27 ^ _DAT_00162f70;
        auVar33 = _DAT_00163090;
        auVar31 = _DAT_001630a0;
        do {
          auVar34 = auVar31 ^ auVar2;
          iVar4 = auVar27._4_4_;
          if ((bool)(~(auVar34._4_4_ == iVar4 && auVar27._0_4_ < auVar34._0_4_ ||
                      iVar4 < auVar34._4_4_) & 1)) {
            pfVar14[uVar6] = INFINITY;
          }
          if ((auVar34._12_4_ != auVar27._12_4_ || auVar34._8_4_ <= auVar27._8_4_) &&
              auVar34._12_4_ <= auVar27._12_4_) {
            pfVar14[uVar6 + 1] = INFINITY;
          }
          auVar34 = auVar33 ^ auVar2;
          iVar5 = auVar34._4_4_;
          if (iVar5 <= iVar4 && (iVar5 != iVar4 || auVar34._0_4_ <= auVar27._0_4_)) {
            pfVar14[uVar6 + 2] = INFINITY;
            pfVar14[uVar6 + 3] = INFINITY;
          }
          uVar6 = uVar6 + 4;
          lVar18 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 4;
          auVar31._8_8_ = lVar18 + 4;
          lVar18 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 4;
          auVar33._8_8_ = lVar18 + 4;
        } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar6);
      }
      if (0 < lVar24) {
        lVar18 = 0;
        pfVar14 = local_248;
        do {
          if (0 < local_270) {
            pppfVar1 = pIVar3->img;
            lVar13 = 0;
            pfVar17 = pfVar14;
            do {
              fVar25 = *(float *)((long)local_238 + lVar13 * 4 + lVar18 * local_270 * 4);
              if ((0.0 < fVar25) && (0 < depth)) {
                uVar6 = 0;
                pfVar19 = pfVar17;
                do {
                  pppfVar1[uVar6][lVar18][lVar13] = *pfVar19 / fVar25;
                  uVar6 = uVar6 + 1;
                  pfVar19 = pfVar19 + lVar21;
                } while ((uint)depth != uVar6);
              }
              lVar13 = lVar13 + 1;
              pfVar17 = pfVar17 + 1;
            } while (lVar13 != local_270);
          }
          lVar18 = lVar18 + 1;
          pfVar14 = pfVar14 + local_270;
        } while (lVar18 != lVar24);
      }
      operator_delete(local_238);
      operator_delete(local_248);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&list._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)suffix._M_dataplus._M_p != &suffix.field_2) {
      operator_delete(suffix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)s_1._M_dataplus._M_p != &s_1.field_2) {
      operator_delete(s_1._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ImageIO::load(ImageFloat &image, const char *name, int ds, long x, long y,
                   long w, long h) const
{
  std::string s=name;
  size_t pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos == s.npos)
  {
    getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
  }
  else
  {
    try
    {
      loadTiled(getBasicImageIO(name, true), image, name, ds, x, y, w, h);
    }
    catch (const std::exception &)
    {
      // if loading as tiled image fails, try loading as image with colon in file name
      getBasicImageIO(name, true).load(image, name, ds, x, y, w, h);
    }
  }
}